

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerResults.cpp
# Opt level: O1

void __thiscall
EnrichableI2cAnalyzerResults::GenerateBubbleText
          (EnrichableI2cAnalyzerResults *this,U64 frame_index,Channel *param_2,
          DisplayBase display_base)

{
  ostream *poVar1;
  AddressDisplay AVar2;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar3;
  U64 packetId;
  size_t sVar4;
  uint uVar5;
  ulonglong uVar6;
  string *bubbleText;
  pointer pbVar7;
  Frame frame;
  char ack [32];
  char number_str [128];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bubbles;
  stringstream outputStream;
  char *local_450 [2];
  char local_440 [16];
  Frame local_430 [16];
  byte local_420;
  undefined7 uStack_41f;
  char local_410;
  byte local_40f;
  undefined8 local_408;
  char acStack_400 [24];
  string local_3e8;
  char local_3c8 [136];
  undefined1 local_340 [24];
  string local_328 [104];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_430);
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar3 = EnrichableAnalyzerSubprocess::BubbleEnabled(this->mSubprocess);
  if (bVar3) {
    this_00 = this->mSubprocess;
    packetId = AnalyzerResults::GetPacketContainingFrameSequential((ulonglong)this);
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"sda","");
    EnrichableAnalyzerSubprocess::EmitBubble
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_340,this_00,packetId,frame_index,local_430,&local_3e8);
    pbVar7 = (pointer)local_340._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
      pbVar7 = (pointer)local_340._0_8_;
    }
    for (; pbVar7 != (pointer)local_340._8_8_; pbVar7 = pbVar7 + 1) {
      AnalyzerResults::AddResultString
                ((char *)this,(pbVar7->_M_dataplus)._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_340);
    goto LAB_00108ccb;
  }
  if ((local_40f & 1) == 0) {
    if ((local_40f & 2) == 0) {
      local_408._0_4_ = 0x4b414e;
    }
    else {
      local_408._0_1_ = 'M';
      local_408._1_1_ = 'i';
      local_408._2_1_ = 's';
      local_408._3_1_ = 's';
      local_408._4_1_ = 'i';
      local_408._5_1_ = 'n';
      local_408._6_1_ = 'g';
      local_408._7_1_ = ' ';
      builtin_strncpy(acStack_400,"ACK/NAK",8);
    }
  }
  else {
    local_408._0_4_ = 0x4b4341;
  }
  if (local_410 == '\0') {
    AVar2 = this->mSettings->mAddressDisplay;
    if (AVar2 == YES_DIRECTION_8) {
      uVar5 = 8;
      uVar6 = CONCAT71(uStack_41f,local_420);
LAB_00108d48:
      AnalyzerHelpers::GetNumberString(uVar6,display_base,uVar5,local_3c8,0x80);
    }
    else {
      if (AVar2 == NO_DIRECTION_8) {
        uVar6 = (ulonglong)((uint)CONCAT71(uStack_41f,local_420) & 0xfe);
        uVar5 = 8;
        goto LAB_00108d48;
      }
      if (AVar2 == NO_DIRECTION_7) {
        uVar6 = CONCAT71(uStack_41f,local_420) >> 1;
        uVar5 = 7;
        goto LAB_00108d48;
      }
    }
    if ((local_420 & 1) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      poVar1 = (ostream *)(local_340 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"W[",2);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Write [",7);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Write [",7);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_408);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_408,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Setup Write to [",0x10);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_408);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_408,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_340);
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      poVar1 = (ostream *)(local_340 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"R[",2);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Read [",6);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Read [",6);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_408);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_408,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      local_450[0] = local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"");
      std::__cxx11::stringbuf::str(local_328);
      if (local_450[0] != local_440) {
        operator_delete(local_450[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Setup Read to [",0xf);
      sVar4 = strlen(local_3c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] + ",4);
      sVar4 = strlen((char *)&local_408);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_408,sVar4);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddResultString
                ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if (local_450[0] != local_440) goto LAB_00108ca5;
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_41f,local_420),display_base,8,local_3c8,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,local_3c8,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    poVar1 = (ostream *)(local_340 + 0x10);
    sVar4 = strlen(local_3c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
    sVar4 = strlen((char *)&local_408);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_408,sVar4);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddResultString
              ((char *)this,local_450[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    if (local_450[0] != local_440) {
LAB_00108ca5:
      operator_delete(local_450[0]);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
LAB_00108ccb:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  Frame::~Frame(local_430);
  return;
}

Assistant:

void EnrichableI2cAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/, DisplayBase display_base )  //unrefereced vars commented out to remove warnings.
{
	//we only need to pay attention to 'channel' if we're making bubbles for more than one channel (as set by AddChannelBubblesWillAppearOn)
	ClearResultStrings();
	Frame frame = GetFrame( frame_index );
	std::stringstream outputStream;

	if(mSubprocess->BubbleEnabled()) {
		std::vector<std::string> bubbles = mSubprocess->EmitBubble(
			GetPacketContainingFrameSequential(frame_index),
			frame_index,
			frame,
			"sda"
		);
		for(const std::string& bubbleText: bubbles) {
			AddResultString(bubbleText.c_str());
		}
	} else {
		char ack[32];
		if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof(ack), "ACK" );
		else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
			snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
		else
			snprintf( ack, sizeof(ack), "NAK" );

		if( frame.mType == I2cAddress )
		{
			char number_str[128];
			switch( mSettings->mAddressDisplay )
			{
			case NO_DIRECTION_7:
				AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );
				break;
			case NO_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1 & 0xFE, display_base, 8, number_str, 128 );
				break;
			case YES_DIRECTION_8:
				AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
				break;
			}

			I2cDirection direction;
			if( ( frame.mData1 & 0x1 ) != 0 )
				direction = I2C_READ;
			else
				direction = I2C_WRITE;

			if( direction == I2C_READ )
			{
				std::stringstream ss;
				AddResultString( "R" );

				ss << "R[" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Read [" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Read [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
				ss.str("");	

				ss << "Setup Read to [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
			}else
			{
				std::stringstream ss;
				ss << "W[" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Write [" << number_str << "]";
				AddResultString( ss.str().c_str() );
				ss.str("");

				ss << "Write [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
				ss.str("");	

				ss << "Setup Write to [" << number_str << "] + " << ack;
				AddResultString( ss.str().c_str() );
			}
		}else
		{
			char number_str[128];
			AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

			AddResultString( number_str );

			std::stringstream ss;
			ss << number_str << " + " << ack;
			AddResultString( ss.str().c_str() );
		}
	}
}